

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_get_ext(uchar **p,uchar *end,mbedtls_x509_buf *ext,int tag)

{
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  size_t len;
  size_t local_20;
  
  if (*p != end) {
    ext->tag = (uint)**p;
    iVar3 = mbedtls_asn1_get_tag(p,end,&ext->len,tag | 0xa0);
    if (iVar3 == 0) {
      ext->p = *p;
      puVar1 = *p;
      sVar2 = ext->len;
      iVar3 = mbedtls_asn1_get_tag(p,puVar1 + sVar2,&local_20,0x30);
      if (iVar3 == 0) {
        iVar3 = -0x2566;
        if (puVar1 + sVar2 == *p + local_20) {
          iVar3 = 0;
        }
      }
      else {
        iVar3 = iVar3 + -0x2500;
      }
    }
    return iVar3;
  }
  return 0;
}

Assistant:

int mbedtls_x509_get_ext( unsigned char **p, const unsigned char *end,
                  mbedtls_x509_buf *ext, int tag )
{
    int ret;
    size_t len;

    if( *p == end )
        return( 0 );

    ext->tag = **p;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &ext->len,
            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | tag ) ) != 0 )
        return( ret );

    ext->p = *p;
    end = *p + ext->len;

    /*
     * Extensions  ::=  SEQUENCE SIZE (1..MAX) OF Extension
     *
     * Extension  ::=  SEQUENCE  {
     *      extnID      OBJECT IDENTIFIER,
     *      critical    BOOLEAN DEFAULT FALSE,
     *      extnValue   OCTET STRING  }
     */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( end != *p + len )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}